

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O0

Function<void_(kj::Function<void_()>)> __thiscall
kj::anon_unknown_0::TestExceptionCallback::getThreadInitializer(TestExceptionCallback *this)

{
  Iface *extraout_RDX;
  Function<void_(kj::Function<void_()>)> FVar1;
  Type local_20 [2];
  TestExceptionCallback *this_local;
  
  this_local = this;
  Function<void(kj::Function<void()>)>::
  Function<kj::(anonymous_namespace)::TestExceptionCallback::getThreadInitializer()::_lambda(kj::Function<void()>)_1_>
            ((Function<void(kj::Function<void()>)> *)this,local_20);
  FVar1.impl.ptr = extraout_RDX;
  FVar1.impl.disposer = (Disposer *)this;
  return (Function<void_(kj::Function<void_()>)>)FVar1.impl;
}

Assistant:

Function<void(Function<void()>)> getThreadInitializer() override {
    return [&](Function<void()> func) {
      KJ_IF_SOME(callback, mainThreadCallback) {
        TestExceptionCallback exceptionCallback(context, callback);
        func();
      } else {
        TestExceptionCallback exceptionCallback(context, *this);
        func();
      }
    };
  }